

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  undefined1 *puVar1;
  char cVar2;
  byte bVar3;
  rar5 *rar;
  wchar_t wVar4;
  long lVar5;
  char *fmt;
  int error_number;
  
  rar = (rar5 *)a->format->data;
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  if (rar->has_encrypted_entries == L'\xffffffff') {
    rar->has_encrypted_entries = L'\0';
  }
  if ((rar->headers_are_encrypted != L'\0') ||
     ((undefined1  [19312])((undefined1  [19312])rar->cstate & (undefined1  [19312])0x10) !=
      (undefined1  [19312])0x0)) {
    fmt = "Reading encrypted data is not currently supported";
    error_number = 0x54;
LAB_0024c46a:
    archive_set_error(&a->archive,error_number,fmt);
    return L'\xffffffe2';
  }
  if (((rar->file).field_0x20 & 8) != 0) {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    return L'\xffffffe7';
  }
  if ((rar->skip_mode == L'\0') && ((rar->file).unpacked_size < (rar->cstate).last_write_ptr)) {
    fmt = "Unpacker has written too many bytes";
    error_number = 0x16;
    goto LAB_0024c46a;
  }
  lVar5 = 0x4b68;
  do {
    cVar2 = *(char *)((long)&rar->header_initialized + lVar5);
    if (cVar2 != '\0') {
      if (buff != (void **)0x0) {
        *buff = *(void **)((long)&rar->skip_mode + lVar5);
      }
      if (size != (size_t *)0x0) {
        *size = *(size_t *)((long)&rar->qlist_offset + lVar5);
      }
      if (offset != (int64_t *)0x0) {
        *offset = *(int64_t *)((long)&rar->rr_offset + lVar5);
      }
      *(undefined1 *)((long)&rar->header_initialized + lVar5) = 0;
      break;
    }
    lVar5 = lVar5 + 0x20;
  } while (lVar5 == 0x4b88);
  if (cVar2 != '\0') {
    return L'\0';
  }
  bVar3 = (rar->file).field_0x20;
  if ((bVar3 & 4) != 0) {
    return L'\x01';
  }
  if ((bVar3 & 2) == 0) {
    wVar4 = (rar->cstate).method;
    if ((uint)(wVar4 + L'\xffffffff') < 5) {
      if (offset != (int64_t *)0x0) {
        *offset = (rar->cstate).last_write_ptr;
      }
      wVar4 = uncompress_file(a);
      goto LAB_0024c538;
    }
    if (wVar4 != L'\0') {
      archive_set_error(&a->archive,0x54,"Compression method not supported: 0x%x");
      wVar4 = L'\xffffffe2';
      goto LAB_0024c538;
    }
  }
  wVar4 = do_unstore_file(a,rar,buff,size,offset);
LAB_0024c538:
  if (wVar4 != L'\0') {
    return wVar4;
  }
  if ((rar->file).bytes_remaining != 0) {
    return L'\0';
  }
  if ((rar->cstate).last_write_ptr == (rar->file).unpacked_size) {
    puVar1 = &(rar->file).field_0x20;
    *puVar1 = *puVar1 | 4;
    wVar4 = verify_global_checksums(a);
    return wVar4;
  }
  return L'\0';
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		rar->has_encrypted_entries = 0;
	}

	if (rar->headers_are_encrypted || rar->cstate.data_encrypted) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Reading encrypted data is not currently supported");
		return ARCHIVE_FATAL;
	}

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}